

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Writer.cpp
# Opt level: O3

void __thiscall adios2::core::engine::BP3Writer::PerformPuts(BP3Writer *this)

{
  _Rb_tree_node_base *name;
  size_t dataIn;
  DataType DVar1;
  int iVar2;
  Variable<signed_char> *variable;
  Variable<char> *variable_00;
  Variable<long_double> *variable_01;
  Variable<unsigned_char> *variable_02;
  Variable<std::complex<double>_> *variable_03;
  Variable<unsigned_short> *variable_04;
  Variable<std::complex<float>_> *variable_05;
  Variable<long> *variable_06;
  Variable<int> *variable_07;
  Variable<short> *variable_08;
  Variable<unsigned_int> *variable_09;
  Variable<unsigned_long> *variable_10;
  Variable<double> *variable_11;
  Variable<float> *variable_12;
  _Rb_tree_node_base *p_Var3;
  _func_int *p_Var4;
  _Rb_tree_node_base *p_Var5;
  BP3Serializer *pBVar6;
  ScopedTimer __var261;
  ScopedTimer local_220;
  BP3Serializer *local_218;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((PerformPuts()::__var61 == '\0') &&
     (iVar2 = __cxa_guard_acquire(&PerformPuts()::__var61), iVar2 != 0)) {
    PerformPuts::__var61 = (void *)ps_timer_create_("BP3Writer::PerformPuts");
    __cxa_guard_release(&PerformPuts()::__var61);
  }
  local_220.m_timer = PerformPuts::__var61;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  p_Var4 = (this->m_BP3Serializer).super_BP3Base._vptr_BP3Base[-3];
  if (*(long *)(p_Var4 + 0x390 + (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base) != 0) {
    dataIn = *(size_t *)
              (p_Var4 + 0x398 + (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"in call to PerformPuts","")
    ;
    adios2::format::BPBase::ResizeBuffer
              ((BPBase *)(p_Var4 + (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base),
               dataIn,&local_50);
    pBVar6 = &this->m_BP3Serializer;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    p_Var4 = (pBVar6->super_BP3Base)._vptr_BP3Base[-3];
    p_Var5 = (_Rb_tree_node_base *)(&(pBVar6->super_BP3Base).field_0x370 + (long)p_Var4);
    p_Var3 = *(_Rb_tree_node_base **)(&(pBVar6->super_BP3Base).field_0x380 + (long)p_Var4);
    if (p_Var3 != p_Var5) {
      do {
        local_218 = pBVar6;
        name = p_Var3 + 1;
        DVar1 = IO::InquireVariableType((this->super_Engine).m_IO,(string *)name);
        switch(DVar1) {
        case Int8:
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_90,"in call to PerformPuts, EndStep or Close","");
          variable = Engine::FindVariable<signed_char>(&this->super_Engine,(string *)name,&local_90)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          PerformPutCommon<signed_char>(this,variable);
          break;
        case Int16:
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,"in call to PerformPuts, EndStep or Close","");
          variable_08 = Engine::FindVariable<short>(&this->super_Engine,(string *)name,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          PerformPutCommon<short>(this,variable_08);
          break;
        case Int32:
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d0,"in call to PerformPuts, EndStep or Close","");
          variable_07 = Engine::FindVariable<int>(&this->super_Engine,(string *)name,&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          PerformPutCommon<int>(this,variable_07);
          break;
        case Int64:
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f0,"in call to PerformPuts, EndStep or Close","");
          variable_06 = Engine::FindVariable<long>(&this->super_Engine,(string *)name,&local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p);
          }
          PerformPutCommon<long>(this,variable_06);
          break;
        case UInt8:
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_110,"in call to PerformPuts, EndStep or Close","");
          variable_02 = Engine::FindVariable<unsigned_char>
                                  (&this->super_Engine,(string *)name,&local_110);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p);
          }
          PerformPutCommon<unsigned_char>(this,variable_02);
          break;
        case UInt16:
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_130,"in call to PerformPuts, EndStep or Close","");
          variable_04 = Engine::FindVariable<unsigned_short>
                                  (&this->super_Engine,(string *)name,&local_130);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p);
          }
          PerformPutCommon<unsigned_short>(this,variable_04);
          break;
        case UInt32:
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_150,"in call to PerformPuts, EndStep or Close","");
          variable_09 = Engine::FindVariable<unsigned_int>
                                  (&this->super_Engine,(string *)name,&local_150);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p);
          }
          PerformPutCommon<unsigned_int>(this,variable_09);
          break;
        case UInt64:
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_170,"in call to PerformPuts, EndStep or Close","");
          variable_10 = Engine::FindVariable<unsigned_long>
                                  (&this->super_Engine,(string *)name,&local_170);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p);
          }
          PerformPutCommon<unsigned_long>(this,variable_10);
          break;
        case Float:
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_190,"in call to PerformPuts, EndStep or Close","");
          variable_12 = Engine::FindVariable<float>(&this->super_Engine,(string *)name,&local_190);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p);
          }
          PerformPutCommon<float>(this,variable_12);
          break;
        case Double:
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1b0,"in call to PerformPuts, EndStep or Close","");
          variable_11 = Engine::FindVariable<double>(&this->super_Engine,(string *)name,&local_1b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p);
          }
          PerformPutCommon<double>(this,variable_11);
          break;
        case LongDouble:
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1d0,"in call to PerformPuts, EndStep or Close","");
          variable_01 = Engine::FindVariable<long_double>
                                  (&this->super_Engine,(string *)name,&local_1d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p);
          }
          PerformPutCommon<long_double>(this,variable_01);
          break;
        case FloatComplex:
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1f0,"in call to PerformPuts, EndStep or Close","");
          variable_05 = Engine::FindVariable<std::complex<float>>
                                  (&this->super_Engine,(string *)name,&local_1f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p);
          }
          PerformPutCommon<std::complex<float>>(this,variable_05);
          break;
        case DoubleComplex:
          local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_210,"in call to PerformPuts, EndStep or Close","");
          variable_03 = Engine::FindVariable<std::complex<double>>
                                  (&this->super_Engine,(string *)name,&local_210);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p);
          }
          PerformPutCommon<std::complex<double>>(this,variable_03);
          break;
        case Char:
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,"in call to PerformPuts, EndStep or Close","");
          variable_00 = Engine::FindVariable<char>(&this->super_Engine,(string *)name,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          PerformPutCommon<char>(this,variable_00);
        }
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
        pBVar6 = local_218;
      } while (p_Var3 != p_Var5);
      p_Var4 = (local_218->super_BP3Base)._vptr_BP3Base[-3];
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(&(pBVar6->super_BP3Base).field_0x368 + (long)p_Var4));
    *(undefined8 *)
     (&(pBVar6->super_BP3Base).field_0x398 + (long)(pBVar6->super_BP3Base)._vptr_BP3Base[-3]) = 0;
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_220);
  return;
}

Assistant:

void BP3Writer::PerformPuts()
{
    PERFSTUBS_SCOPED_TIMER("BP3Writer::PerformPuts");
    if (m_BP3Serializer.m_DeferredVariables.empty())
    {
        return;
    }

    m_BP3Serializer.ResizeBuffer(m_BP3Serializer.m_DeferredVariablesDataSize,
                                 "in call to PerformPuts");

    for (const std::string &variableName : m_BP3Serializer.m_DeferredVariables)
    {
        const DataType type = m_IO.InquireVariableType(variableName);
        if (type == DataType::Struct)
        {
            // not supported
        }
#define declare_template_instantiation(T)                                                          \
    else if (type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        Variable<T> &variable =                                                                    \
            FindVariable<T>(variableName, "in call to PerformPuts, EndStep or Close");             \
        PerformPutCommon(variable);                                                                \
    }

        ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation
    }
    m_BP3Serializer.m_DeferredVariables.clear();
    m_BP3Serializer.m_DeferredVariablesDataSize = 0;
}